

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superAnd.c
# Opt level: O3

void Super2_Precompute(int nInputs,int nLevels,int fVerbose)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  char cVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  int iVar14;
  Extra_MmFixed_t *p;
  Super2_Lib_t *pSVar15;
  Super2_Gate_t **ppSVar16;
  Super2_Gate_t *pSVar17;
  Super2_Gate_t *pSVar18;
  Super2_Lib_t *pLib;
  stmm_table *psVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  timespec ts;
  char **local_e8;
  uint local_dc;
  Super2_Lib_t *local_d8;
  Super2_Gate_t *local_d0;
  stmm_table *local_c8;
  ulong local_c0;
  uint local_b4;
  Super2_Gate_t *local_b0;
  ulong local_a8;
  long local_a0;
  timespec local_98 [6];
  
  local_b4 = nLevels;
  if (5 < nInputs) {
    __assert_fail("nInputs < 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/super/superAnd.c"
                  ,0x78,"void Super2_Precompute(int, int, int)");
  }
  p = Extra_MmFixedStart(0x20);
  local_c8 = stmm_init_table(st__ptrcmp,st__ptrhash);
  pSVar15 = (Super2_Lib_t *)calloc(1,0x30);
  pSVar15->nInputs = nInputs;
  uVar29 = 1 << ((byte)nInputs & 0x1f);
  pSVar15->nMints = uVar29;
  pSVar15->nGates = nInputs + 1;
  pSVar15->nGatesAlloc = nInputs + 1;
  pSVar15->uMaskBit = 1 << ((char)uVar29 - 1U & 0x1f);
  ppSVar16 = (Super2_Gate_t **)malloc((long)nInputs * 8 + 8);
  pSVar15->pGates = ppSVar16;
  local_d8 = pSVar15;
  pSVar17 = (Super2_Gate_t *)Extra_MmFixedEntryFetch(p);
  *ppSVar16 = pSVar17;
  *(undefined8 *)pSVar17 = 0;
  pSVar17->pOne = (Super2_Gate_t *)0x0;
  pSVar17->pTwo = (Super2_Gate_t *)0x0;
  pSVar17->pNext = (Super2_Gate_t *)0x0;
  if (0 < nInputs) {
    pSVar17 = (Super2_Gate_t *)0x0;
    do {
      pSVar18 = (Super2_Gate_t *)Extra_MmFixedEntryFetch(p);
      ppSVar16[(long)((long)&pSVar17->uTruth + 1)] = pSVar18;
      *(undefined8 *)pSVar18 = 0;
      pSVar18->pOne = (Super2_Gate_t *)0x0;
      pSVar18->pTwo = (Super2_Gate_t *)0x0;
      pSVar18->pNext = (Super2_Gate_t *)0x0;
      ppSVar16[(long)((long)&pSVar17->uTruth + 1)]->pTwo = pSVar17;
      pSVar17 = (Super2_Gate_t *)((long)&pSVar17->uTruth + 1);
    } while ((Super2_Gate_t *)(ulong)(uint)nInputs != pSVar17);
  }
  uVar24 = local_b4;
  uVar20 = 0;
  do {
    if (0 < nInputs) {
      pSVar17 = (Super2_Gate_t *)0x0;
      do {
        if ((uVar20 >> ((uint)pSVar17 & 0x1f) & 1) != 0) {
          ppSVar16[(long)((long)&pSVar17->uTruth + 1)]->uTruth =
               ppSVar16[(long)((long)&pSVar17->uTruth + 1)]->uTruth | 1 << ((byte)uVar20 & 0x1f);
        }
        pSVar17 = (Super2_Gate_t *)((long)&pSVar17->uTruth + 1);
      } while ((Super2_Gate_t *)(ulong)(uint)nInputs != pSVar17);
    }
    uVar20 = uVar20 + 1;
  } while (uVar20 != uVar29);
  printf("Computing supergates for %d inputs and %d levels:\n",(ulong)(uint)nInputs,(ulong)local_b4)
  ;
  psVar19 = local_c8;
  pSVar15 = local_d8;
  if ((int)uVar24 < 1) {
    puts("Writing the output file...");
    fflush(_stdout);
  }
  local_a8 = 1;
  iVar14 = clock_gettime(3,local_98);
  local_a0 = 1;
  if (-1 < iVar14) {
    lVar22 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98[0].tv_nsec),8);
    local_a0 = ((lVar22 >> 7) - (lVar22 >> 0x3f)) + local_98[0].tv_sec * -1000000;
  }
  pLib = (Super2_Lib_t *)calloc(1,0x30);
  uVar1 = *(undefined1 *)((long)&pSVar15->nInputs + 1);
  uVar2 = *(undefined1 *)((long)&pSVar15->nInputs + 2);
  uVar3 = *(undefined1 *)((long)&pSVar15->nInputs + 3);
  cVar4 = (char)pSVar15->nMints;
  uVar5 = *(undefined1 *)((long)&pSVar15->nMints + 1);
  uVar6 = *(undefined1 *)((long)&pSVar15->nMints + 2);
  uVar7 = *(undefined1 *)((long)&pSVar15->nMints + 3);
  iVar14 = pSVar15->nLevels;
  uVar8 = *(undefined1 *)((long)&pSVar15->nLevels + 1);
  uVar9 = *(undefined1 *)((long)&pSVar15->nLevels + 2);
  uVar10 = *(undefined1 *)((long)&pSVar15->nLevels + 3);
  iVar26 = pSVar15->nGates;
  uVar11 = *(undefined1 *)((long)&pSVar15->nGates + 1);
  uVar12 = *(undefined1 *)((long)&pSVar15->nGates + 2);
  uVar13 = *(undefined1 *)((long)&pSVar15->nGates + 3);
  local_dc = 0xffffffff >> (-cVar4 & 0x1fU);
  uVar29 = pSVar15->nGates;
  uVar30 = (ulong)(int)uVar29;
  *(char *)&pLib->nInputs = (char)pSVar15->nInputs;
  *(undefined1 *)((long)&pLib->nInputs + 1) = uVar1;
  *(undefined1 *)((long)&pLib->nInputs + 2) = uVar2;
  *(undefined1 *)((long)&pLib->nInputs + 3) = uVar3;
  *(char *)&pLib->nMints = cVar4;
  *(undefined1 *)((long)&pLib->nMints + 1) = uVar5;
  *(undefined1 *)((long)&pLib->nMints + 2) = uVar6;
  *(undefined1 *)((long)&pLib->nMints + 3) = uVar7;
  *(char *)&pLib->nLevels = (char)iVar14;
  *(undefined1 *)((long)&pLib->nLevels + 1) = uVar8;
  *(undefined1 *)((long)&pLib->nLevels + 2) = uVar9;
  *(undefined1 *)((long)&pLib->nLevels + 3) = uVar10;
  *(char *)&pLib->nGates = (char)iVar26;
  *(undefined1 *)((long)&pLib->nGates + 1) = uVar11;
  *(undefined1 *)((long)&pLib->nGates + 2) = uVar12;
  *(undefined1 *)((long)&pLib->nGates + 3) = uVar13;
  local_b0 = (Super2_Gate_t *)CONCAT44(local_b0._4_4_,pSVar15->uMaskBit);
  pLib->uMaskBit = pSVar15->uMaskBit;
  iVar14 = pSVar15->nGatesAlloc;
  pLib->nGatesAlloc = iVar14 + 1000;
  local_d0 = (Super2_Gate_t *)malloc((long)iVar14 * 8 + 8000);
  pLib->pGates = (Super2_Gate_t **)local_d0;
  memcpy(local_d0,pSVar15->pGates,uVar30 << 3);
  stmm_free_table(psVar19);
  psVar19 = stmm_init_table(st__ptrcmp,st__ptrhash);
  local_d8 = pSVar15;
  local_c0 = uVar30;
  if ((int)uVar29 < 1) {
    uVar30 = 0;
  }
  else {
    uVar27 = 0;
    do {
      pSVar17 = *(Super2_Gate_t **)(&local_d0->uTruth + uVar27 * 2);
      uVar30 = uVar27;
      if (pSVar17 == (Super2_Gate_t *)0x0) break;
      uVar24 = pSVar17->uTruth;
      uVar20 = ~uVar24 & local_dc;
      if (((uint)local_b0 & uVar24) == 0) {
        uVar20 = uVar24;
      }
      iVar14 = stmm_lookup(psVar19,(char *)(ulong)uVar20,(char **)local_98);
      if (iVar14 != 0) {
        pLib->i = (int)uVar27;
        puts("New gate:");
        Super2_LibWriteGate((FILE *)_stdout,pLib,pSVar17);
        puts("Gate in the table:");
        Super2_LibWriteGate((FILE *)_stdout,pLib,(Super2_Gate_t *)local_98[0].tv_sec);
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/super/superAnd.c"
                      ,0x167,"Super2_Lib_t *Super2_LibCompute(Super2_Man_t *, Super2_Lib_t *)");
      }
      stmm_insert(psVar19,(char *)(ulong)uVar20,(char *)pSVar17);
      uVar27 = uVar27 + 1;
      uVar30 = (ulong)uVar29;
    } while (uVar29 != uVar27);
  }
  uVar29 = local_dc;
  pLib->i = (int)uVar30;
  local_d8->i = 0;
  uVar30 = local_c0;
  pSVar15 = local_d8;
  if (0 < local_d8->nGates) {
    iVar14 = 0;
    local_c8 = psVar19;
    do {
      local_d0 = pSVar15->pGates[iVar14];
      if (local_d0 == (Super2_Gate_t *)0x0) break;
      if ((iVar14 != 0) && (iVar14 == (iVar14 / 300) * 300)) {
        printf("Tried %5d first gates...\n");
        fflush(_stdout);
      }
      pSVar15->k = 0;
      if ((0 < iVar14) &&
         (local_98[0].tv_sec = (__time_t)*pSVar15->pGates,
         (Super2_Gate_t *)local_98[0].tv_sec != (Super2_Gate_t *)0x0)) {
        local_b0 = (Super2_Gate_t *)((ulong)local_d0 ^ 1);
        iVar26 = (int)uVar30;
        do {
          local_c0 = (ulong)(iVar26 + 4);
          uVar24 = local_d0->uTruth;
          uVar20 = ((Super2_Gate_t *)local_98[0].tv_sec)->uTruth;
          uVar28 = uVar20 & uVar24;
          uVar23 = pLib->uMaskBit;
          uVar25 = ~uVar28 & uVar29;
          if ((uVar28 & uVar23) == 0) {
            uVar25 = uVar28;
          }
          iVar14 = stmm_find_or_add(psVar19,(char *)(ulong)uVar25,&local_e8);
          if (iVar14 == 0) {
            pSVar17 = (Super2_Gate_t *)Extra_MmFixedEntryFetch(p);
            pSVar17->pOne = local_d0;
            pSVar17->pTwo = (Super2_Gate_t *)local_98[0].tv_sec;
            pSVar17->uTruth = uVar28;
            *local_e8 = (char *)pSVar17;
            Super2_LibAddGate(pLib,pSVar17);
            uVar23 = pLib->uMaskBit;
          }
          uVar28 = ~uVar24 & uVar29 & uVar20;
          uVar25 = uVar23 & uVar28;
          if ((uVar23 & uVar28) != 0) {
            uVar25 = uVar29;
          }
          iVar14 = stmm_find_or_add(local_c8,(char *)(ulong)(uVar25 ^ uVar28),&local_e8);
          if (iVar14 == 0) {
            pSVar17 = (Super2_Gate_t *)Extra_MmFixedEntryFetch(p);
            pSVar17->pOne = local_b0;
            pSVar17->pTwo = (Super2_Gate_t *)local_98[0].tv_sec;
            pSVar17->uTruth = uVar28;
            *local_e8 = (char *)pSVar17;
            Super2_LibAddGate(pLib,pSVar17);
            uVar23 = pLib->uMaskBit;
          }
          psVar19 = local_c8;
          uVar28 = uVar24 & uVar29 & ~uVar20;
          uVar25 = uVar23 & uVar28;
          if ((uVar23 & uVar28) != 0) {
            uVar25 = uVar29;
          }
          iVar14 = stmm_find_or_add(local_c8,(char *)(ulong)(uVar25 ^ uVar28),&local_e8);
          if (iVar14 == 0) {
            pSVar17 = (Super2_Gate_t *)Extra_MmFixedEntryFetch(p);
            pSVar17->pOne = local_d0;
            pSVar17->pTwo = (Super2_Gate_t *)(local_98[0].tv_sec ^ 1);
            pSVar17->uTruth = uVar28;
            *local_e8 = (char *)pSVar17;
            Super2_LibAddGate(pLib,pSVar17);
            uVar23 = pLib->uMaskBit;
          }
          uVar20 = ~uVar24 & uVar29 & ~uVar20;
          uVar24 = uVar23 & uVar20;
          if ((uVar23 & uVar20) != 0) {
            uVar24 = uVar29;
          }
          iVar14 = stmm_find_or_add(psVar19,(char *)(ulong)(uVar24 ^ uVar20),&local_e8);
          if (iVar14 == 0) {
            pSVar17 = (Super2_Gate_t *)Extra_MmFixedEntryFetch(p);
            pSVar17->pOne = local_b0;
            pSVar17->pTwo = (Super2_Gate_t *)(local_98[0].tv_sec ^ 1);
            pSVar17->uTruth = uVar20;
            *local_e8 = (char *)pSVar17;
            Super2_LibAddGate(pLib,pSVar17);
          }
          iVar26 = local_d8->k;
          iVar21 = iVar26 + 1;
          local_d8->k = iVar21;
          iVar14 = local_d8->i;
          uVar30 = local_c0;
          pSVar15 = local_d8;
          if (iVar14 <= iVar21) break;
          local_98[0].tv_sec = (__time_t)local_d8->pGates[(long)iVar26 + 1];
          iVar26 = (int)local_c0;
        } while ((Super2_Gate_t *)local_98[0].tv_sec != (Super2_Gate_t *)0x0);
      }
      iVar14 = iVar14 + 1;
      pSVar15->i = iVar14;
    } while (iVar14 < pSVar15->nGates);
  }
  uVar27 = local_a8;
  pLib->nLevels = (int)local_a8;
  Super2_LibStop(pSVar15);
  iVar14 = 0x9836e8;
  printf("Level %d:  Tried = %7d.  Computed = %7d.  ",uVar27 & 0xffffffff,uVar30 & 0xffffffff,
         (ulong)(uint)pLib->nGates);
  Abc_Print(iVar14,"%s =","Runtime");
  iVar26 = 3;
  iVar14 = clock_gettime(3,local_98);
  if (iVar14 < 0) {
    lVar22 = -1;
  }
  else {
    lVar22 = local_98[0].tv_nsec / 1000 + local_98[0].tv_sec * 1000000;
  }
  Abc_Print(iVar26,"%9.2f sec\n",(double)(lVar22 + local_a0) / 1000000.0);
  fflush(_stdout);
}

Assistant:

void Super2_Precompute( int nInputs, int nLevels, int fVerbose )
{
    Super2_Man_t * pMan;
    Super2_Lib_t * pLibCur, * pLibNext;
    int Level;
    abctime clk;

    assert( nInputs < 6 );

    // start the manager
    pMan = Super2_ManStart();

    // get the starting supergates
    pLibCur = Super2_LibFirst( pMan, nInputs );

    // perform the computation of supergates
printf( "Computing supergates for %d inputs and %d levels:\n", nInputs, nLevels );
    for ( Level = 1; Level <= nLevels; Level++ )
    {
clk = Abc_Clock();
        pLibNext = Super2_LibCompute( pMan, pLibCur );
        pLibNext->nLevels = Level;
        Super2_LibStop( pLibCur );
        pLibCur = pLibNext;
printf( "Level %d:  Tried = %7d.  Computed = %7d.  ", Level, pMan->nTried, pLibCur->nGates );
ABC_PRT( "Runtime", Abc_Clock() - clk );
fflush( stdout );
    }

printf( "Writing the output file...\n" );
fflush( stdout );
    // write them into a file
    Super2_LibWrite( pLibCur );
    Super2_LibStop( pLibCur );

    // stop the manager
    Super2_ManStop( pMan );
}